

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 MemBackendPoolFree(SyMemBackend *pBackend,void *pChunk)

{
  uint uVar1;
  SyMemHeader *pChunk_00;
  sxu32 nBucket;
  SyMemHeader *pHeader;
  void *pChunk_local;
  SyMemBackend *pBackend_local;
  
  pChunk_00 = (SyMemHeader *)((long)pChunk + -8);
  if (pChunk_00->nBucket >> 0x10 == 0xdead) {
    uVar1 = pChunk_00->nBucket;
    if ((uVar1 & 0xffff) == 0xffff) {
      MemBackendFree(pBackend,pChunk_00);
    }
    else {
      *pChunk_00 = *(SyMemHeader *)(pBackend->apPool + (uVar1 & 0xf));
      pBackend->apPool[uVar1 & 0xf] = pChunk_00;
    }
    pBackend_local._4_4_ = 0;
  }
  else {
    pBackend_local._4_4_ = -0x18;
  }
  return pBackend_local._4_4_;
}

Assistant:

static sxi32 MemBackendPoolFree(SyMemBackend *pBackend, void * pChunk)
{
	SyMemHeader *pHeader;
	sxu32 nBucket;
	/* Get the corresponding bucket */
	pHeader = (SyMemHeader *)(((char *)pChunk) - sizeof(SyMemHeader));
	/* Sanity check to avoid misuse */
	if( (pHeader->nBucket >> 16) != SXMEM_POOL_MAGIC ){
		return SXERR_CORRUPT;
	}
	nBucket = pHeader->nBucket & 0xFFFF;
	if( nBucket == SXU16_HIGH ){
		/* Free the big block */
		MemBackendFree(&(*pBackend), pHeader);
	}else{
		/* Return to the free list */
		pHeader->pNext = pBackend->apPool[nBucket & 0x0f];
		pBackend->apPool[nBucket & 0x0f] = pHeader;
	}
	return SXRET_OK;
}